

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(void)

{
  uint uVar1;
  int iVar2;
  bool bVar3;
  timespec start;
  timespec end;
  
  clock_gettime(1,(timespec *)&start);
  iVar2 = 10000000;
  while (bVar3 = iVar2 != 0, iVar2 = iVar2 + -1, bVar3) {
    _global_ = simple_return(_global_);
  }
  clock_gettime(1,(timespec *)&end);
  printf("%s, simple:\n\t %lld\n","main",
         ((end.tv_sec - start.tv_sec) * 1000000000 + end.tv_nsec) - start.tv_nsec);
  clock_gettime(1,(timespec *)&start);
  iVar2 = 10000000;
  while (bVar3 = iVar2 != 0, iVar2 = iVar2 + -1, bVar3) {
    _global_ = memcpy_return(_global_);
  }
  clock_gettime(1,(timespec *)&end);
  printf("%s, memcpy:\n\t %lld\n","main",
         ((end.tv_sec - start.tv_sec) * 1000000000 + end.tv_nsec) - start.tv_nsec);
  uVar1 = float_to_int1(1.23);
  printf("%s, %d\n","main",(ulong)uVar1);
  uVar1 = float_to_int2(1.23);
  printf("%s, %d\n","main",(ulong)uVar1);
  uVar1 = float_to_int3(1.23);
  printf("%s, %d\n","main",(ulong)uVar1);
  clock_gettime(1,(timespec *)&start);
  iVar2 = 10000000;
  while (bVar3 = iVar2 != 0, iVar2 = iVar2 + -1, bVar3) {
    _global_ = float_to_int3(1.23);
  }
  clock_gettime(1,(timespec *)&end);
  printf("%s, memcpy2:\n\t %lld\n","main",
         ((end.tv_sec - start.tv_sec) * 1000000000 + end.tv_nsec) - start.tv_nsec);
  clock_gettime(1,(timespec *)&start);
  iVar2 = 10000000;
  while (bVar3 = iVar2 != 0, iVar2 = iVar2 + -1, bVar3) {
    _global_ = float_to_int1(1.23);
  }
  clock_gettime(1,(timespec *)&end);
  printf("%s, memcpy:\n\t %lld\n","main",
         ((end.tv_sec - start.tv_sec) * 1000000000 + end.tv_nsec) - start.tv_nsec);
  clock_gettime(1,(timespec *)&start);
  iVar2 = 10000000;
  while (bVar3 = iVar2 != 0, iVar2 = iVar2 + -1, bVar3) {
    _global_ = float_to_int2(1.23);
  }
  clock_gettime(1,(timespec *)&end);
  printf("%s, cast:\n\t %lld\n","main",
         ((end.tv_sec - start.tv_sec) * 1000000000 + end.tv_nsec) - start.tv_nsec);
  return 0;
}

Assistant:

int
main()
{
    unsigned int i;
    struct timespec start, end;
    long long t;
    clock_gettime(CLOCK_ID, &start);
    for (i = 0;i < N;i++) {
        _global_ = simple_return(_global_);
    }
    clock_gettime(CLOCK_ID, &end);
    t = ((end.tv_sec - start.tv_sec) * 1000000000)
        + end.tv_nsec - start.tv_nsec;
    printf("%s, simple:\n\t %lld\n", __func__, t);

    clock_gettime(CLOCK_ID, &start);
    for (i = 0;i < N;i++) {
        _global_ = memcpy_return(_global_);
    }
    clock_gettime(CLOCK_ID, &end);
    t = ((end.tv_sec - start.tv_sec) * 1000000000)
        + end.tv_nsec - start.tv_nsec;
    printf("%s, memcpy:\n\t %lld\n", __func__, t);

    float f = 1.23;

    printf("%s, %d\n", __func__, float_to_int1(f));
    printf("%s, %d\n", __func__, float_to_int2(f));
    printf("%s, %d\n", __func__, float_to_int3(f));

    clock_gettime(CLOCK_ID, &start);
    for (i = 0;i < N;i++) {
        _global_ = float_to_int3(f);
    }
    clock_gettime(CLOCK_ID, &end);
    t = ((end.tv_sec - start.tv_sec) * 1000000000)
        + end.tv_nsec - start.tv_nsec;
    printf("%s, memcpy2:\n\t %lld\n", __func__, t);

    clock_gettime(CLOCK_ID, &start);
    for (i = 0;i < N;i++) {
        _global_ = float_to_int1(f);
    }
    clock_gettime(CLOCK_ID, &end);
    t = ((end.tv_sec - start.tv_sec) * 1000000000)
        + end.tv_nsec - start.tv_nsec;
    printf("%s, memcpy:\n\t %lld\n", __func__, t);

    clock_gettime(CLOCK_ID, &start);
    for (i = 0;i < N;i++) {
        _global_ = float_to_int2(f);
    }
    clock_gettime(CLOCK_ID, &end);
    t = ((end.tv_sec - start.tv_sec) * 1000000000)
        + end.tv_nsec - start.tv_nsec;
    printf("%s, cast:\n\t %lld\n", __func__, t);

    return 0;
}